

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

Error __thiscall asmjit::ZoneBitVector::fill(ZoneBitVector *this,size_t from,size_t to,bool value)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  if (to <= from) {
    return (uint)(to < from) + (uint)(to < from) * 2;
  }
  if (*(ulong *)(this + 8) < from) {
    fill();
LAB_0015f27b:
    fill();
  }
  else {
    if (*(ulong *)(this + 8) < to) goto LAB_0015f27b;
    lVar2 = *(long *)this;
    if (lVar2 != 0) {
      uVar3 = from >> 6;
      uVar5 = (uint)from & 0x3f;
      uVar6 = to >> 6;
      uVar4 = (uint)to & 0x3f;
      if ((from & 0x3f) == 0) {
LAB_0015f1dd:
        if (uVar3 <= uVar6 && uVar6 - uVar3 != 0) {
          auVar8 = vpbroadcastq_avx512f();
          auVar9 = vpbroadcastq_avx512f();
          uVar7 = 0;
          auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            auVar11 = vpbroadcastq_avx512f();
            auVar11 = vporq_avx512f(auVar11,auVar10);
            vpcmpuq_avx512f(auVar11,auVar8,2);
            auVar11 = vmovdqu64_avx512f(auVar9);
            *(undefined1 (*) [64])(lVar2 + uVar3 * 8 + uVar7 * 8) = auVar11;
            uVar7 = uVar7 + 8;
          } while (((uVar6 - uVar3) + 7 & 0xfffffffffffffff8) != uVar7);
        }
        if ((to & 0x3f) == 0) {
          return 0;
        }
        if (value) {
          puVar1 = (ulong *)(lVar2 + uVar6 * 8);
          *puVar1 = *puVar1 | ~(-1L << uVar4);
          return 0;
        }
        puVar1 = (ulong *)(lVar2 + uVar6 * 8);
        *puVar1 = *puVar1 & -1L << uVar4;
        return 0;
      }
      if (uVar3 != uVar6) {
        if (value) {
          puVar1 = (ulong *)(lVar2 + uVar3 * 8);
          *puVar1 = *puVar1 | -1L << uVar5;
        }
        else {
          puVar1 = (ulong *)(lVar2 + uVar3 * 8);
          *puVar1 = *puVar1 & ~(-1L << uVar5);
        }
        uVar3 = uVar3 + 1;
        goto LAB_0015f1dd;
      }
      if (uVar5 < uVar4) {
        uVar6 = ~(-1L << ((ulong)(uVar4 - uVar5) & 0x3f)) << uVar5;
        if (value) {
          puVar1 = (ulong *)(lVar2 + uVar3 * 8);
          *puVar1 = *puVar1 | uVar6;
        }
        else {
          puVar1 = (ulong *)(lVar2 + uVar3 * 8);
          *puVar1 = *puVar1 & ~uVar6;
        }
        return 0;
      }
      goto LAB_0015f285;
    }
  }
  fill();
LAB_0015f285:
  fill();
}

Assistant:

Error ZoneBitVector::fill(size_t from, size_t to, bool value) noexcept {
  if (ASMJIT_UNLIKELY(from >= to)) {
    if (from > to)
      return DebugUtils::errored(kErrorInvalidArgument);
    else
      return kErrorOk;
  }

  ASMJIT_ASSERT(from <= _length);
  ASMJIT_ASSERT(to <= _length);

  // This is very similar to `ZoneBitVector::_fill()`, however, since we
  // actually set bits that are already part of the container we need to
  // special case filiing to zeros and ones.
  size_t idx = from / kBitsPerWord;
  size_t startBit = from % kBitsPerWord;

  size_t endIdx = to / kBitsPerWord;
  size_t endBit = to % kBitsPerWord;

  BitWord* data = _data;
  ASMJIT_ASSERT(data != nullptr);

  // Special case for non-zero `startBit`.
  if (startBit) {
    if (idx == endIdx) {
      ASMJIT_ASSERT(startBit < endBit);

      size_t nBits = endBit - startBit;
      BitWord mask = ((static_cast<BitWord>(1) << nBits) - 1) << startBit;

      if (value)
        data[idx] |= mask;
      else
        data[idx] &= ~mask;
      return kErrorOk;
    }
    else {
      BitWord mask = (static_cast<BitWord>(0) - 1) << startBit;

      if (value)
        data[idx++] |= mask;
      else
        data[idx++] &= ~mask;
    }
  }

  // Fill all bits in case there is a gap between the current `idx` and `endIdx`.
  if (idx < endIdx) {
    BitWord pattern = _patternFromBit(value);
    do {
      data[idx++] = pattern;
    } while (idx < endIdx);
  }

  // Special case for non-zero `endBit`.
  if (endBit) {
    BitWord mask = ((static_cast<BitWord>(1) << endBit) - 1);
    if (value)
      data[endIdx] |= mask;
    else
      data[endIdx] &= ~mask;
  }

  return kErrorOk;
}